

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O3

void __thiscall Cleaner::DoCleanTarget(Cleaner *this,Node *target)

{
  _Rb_tree_header *p_Var1;
  Edge *this_00;
  Node *target_00;
  bool bVar2;
  pointer ppNVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pointer ppNVar6;
  Node *local_28;
  
  this_00 = target->in_edge_;
  local_28 = target;
  if (this_00 != (Edge *)0x0) {
    bVar2 = Edge::is_phony(this_00);
    if (!bVar2) {
      Remove(this,&target->env_path_);
      RemoveEdgeFiles(this,this_00);
    }
    ppNVar6 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar3 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppNVar6 != ppNVar3) {
      p_Var1 = &(this->cleaned_)._M_t._M_impl.super__Rb_tree_header;
      do {
        target_00 = *ppNVar6;
        p_Var4 = (this->cleaned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = &p_Var1->_M_header;
        if (p_Var4 == (_Base_ptr)0x0) {
LAB_0017f362:
          DoCleanTarget(this,target_00);
          ppNVar3 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          do {
            if (*(Node **)(p_Var4 + 1) >= target_00) {
              p_Var5 = p_Var4;
            }
            p_Var4 = (&p_Var4->_M_left)[*(Node **)(p_Var4 + 1) < target_00];
          } while (p_Var4 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var5 == p_Var1) ||
             (target_00 < (Node *)((_Rb_tree_header *)p_Var5)->_M_node_count)) goto LAB_0017f362;
        }
        ppNVar6 = ppNVar6 + 1;
      } while (ppNVar6 != ppNVar3);
    }
  }
  std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
  _M_insert_unique<Node*const&>
            ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *)
             &this->cleaned_,&local_28);
  return;
}

Assistant:

void Cleaner::DoCleanTarget(Node* target) {
  if (Edge* e = target->in_edge()) {
    // Do not try to remove phony targets
    if (!e->is_phony()) {
      Remove(target->path());
      RemoveEdgeFiles(e);
    }
    for (vector<Node*>::iterator n = e->inputs_.begin(); n != e->inputs_.end();
         ++n) {
      Node* next = *n;
      // call DoCleanTarget recursively if this node has not been visited
      if (cleaned_.count(next) == 0) {
        DoCleanTarget(next);
      }
    }
  }

  // mark this target to be cleaned already
  cleaned_.insert(target);
}